

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O0

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_>::weight_stadium
          (PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *this,PolarExtentCoreContext *ctx,
          PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *position)

{
  batch sin_angle;
  batch cos_angle;
  bool bVar1;
  batch *pbVar2;
  long in_RSI;
  undefined8 in_RDI;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  batch *pbVar6;
  batch circle_val;
  batch<float,_xsimd::fma3<xsimd::avx2>_> circle_dot;
  batch straight_val;
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> in_straight_line_part;
  batch<float,_xsimd::fma3<xsimd::avx2>_> circle_test_dot;
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> position_t_right;
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> position_t;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffca0;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffca8;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffcb0;
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> *cond;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffcc8;
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> *other;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffcd0;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *self;
  float val;
  batch<float,_xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffce0;
  extent_float_t *in_stack_fffffffffffffd18;
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *in_stack_fffffffffffffd20;
  undefined1 local_200 [40];
  PolarExtentCoreContext *in_stack_fffffffffffffe28;
  PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined1 auVar7 [24];
  batch<float,_xsimd::fma3<xsimd::avx2>_> local_140;
  batch_bool<float,_xsimd::fma3<xsimd::avx2>_> abStack_120 [2];
  undefined1 local_e0 [112];
  long local_70;
  
  val = (float)((ulong)in_RDI >> 0x20);
  local_70 = in_RSI;
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_>::transform
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  memcpy(&local_140,local_e0,0x60);
  xsimd::abs<float,xsimd::fma3<xsimd::avx2>>(in_stack_fffffffffffffcb0);
  xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffce0,val);
  cond = abStack_120;
  auVar7 = ZEXT424(*(uint *)(local_70 + 0x6c));
  xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffce0,val);
  xsimd::operator*(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  xsimd::fma<float,xsimd::fma3<xsimd::avx2>>
            ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)cond,in_stack_fffffffffffffca8,
             in_stack_fffffffffffffca0);
  uVar3._0_4_ = 0.0;
  uVar3._4_4_ = 0.0;
  uVar4._0_4_ = 0.0;
  uVar4._4_4_ = 0.0;
  uVar5._0_4_ = 0.0;
  uVar5._4_4_ = 0.0;
  pbVar2 = (batch *)0x0;
  xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffce0,val);
  xsimd::operator>=((batch<float,_xsimd::fma3<xsimd::avx2>_> *)cond,in_stack_fffffffffffffca8);
  local_200._0_8_ = uVar3;
  local_200._8_8_ = uVar4;
  local_200._16_8_ = uVar5;
  local_200._24_8_ = pbVar2;
  xsimd::abs<float,xsimd::fma3<xsimd::avx2>>((batch<float,_xsimd::fma3<xsimd::avx2>_> *)cond);
  sin_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[2] =
       (float)auVar7._0_4_;
  sin_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[3] =
       (float)auVar7._4_4_;
  sin_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[4] =
       (float)auVar7._8_4_;
  sin_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[5] =
       (float)auVar7._12_4_;
  sin_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[6] =
       (float)auVar7._16_4_;
  sin_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[7] =
       (float)auVar7._20_4_;
  sin_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[0] =
       (float)(int)in_stack_fffffffffffffe38;
  sin_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[1] =
       (float)(int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  weight_from_sin(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,sin_angle);
  self = &local_140;
  xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffce0,val);
  other = abStack_120;
  pbVar6 = (batch *)0x0;
  xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>::batch(in_stack_fffffffffffffce0,val);
  xsimd::operator*(self,(batch<float,_xsimd::fma3<xsimd::avx2>_> *)other);
  xsimd::fma<float,xsimd::fma3<xsimd::avx2>>
            ((batch<float,_xsimd::fma3<xsimd::avx2>_> *)cond,in_stack_fffffffffffffca8,
             in_stack_fffffffffffffca0);
  cos_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[2] =
       (float)auVar7._0_4_;
  cos_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[3] =
       (float)auVar7._4_4_;
  cos_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[4] =
       (float)auVar7._8_4_;
  cos_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[5] =
       (float)auVar7._12_4_;
  cos_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[6] =
       (float)auVar7._16_4_;
  cos_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[7] =
       (float)auVar7._20_4_;
  cos_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[0] =
       (float)(int)in_stack_fffffffffffffe38;
  cos_angle.super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
  super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data[1] =
       (float)(int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  weight_from_cos(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,cos_angle);
  bVar1 = xsimd::all<float,xsimd::fma3<xsimd::avx2>>
                    ((batch_bool<float,_xsimd::fma3<xsimd::avx2>_> *)local_200);
  if ((!bVar1) &&
     (pbVar2 = pbVar6,
     bVar1 = xsimd::none<float,xsimd::fma3<xsimd::avx2>>
                       ((batch_bool<float,_xsimd::fma3<xsimd::avx2>_> *)local_200), !bVar1)) {
    pbVar2 = xsimd::select<float,xsimd::fma3<xsimd::avx2>>
                       (cond,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  }
  return pbVar2;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }